

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgBuiltinFunctions.hpp
# Opt level: O2

bool rsg::InvSqrtOp::transformValueRange(float outMin,float outMax,float *inMin,float *inMax)

{
  bool bVar1;
  
  bVar1 = outMin <= 3.0 && 0.4 <= outMax;
  if (bVar1) {
    if (outMin <= 0.4) {
      outMin = 0.4;
    }
    *inMax = 1.0 / outMin;
    if (3.0 <= outMax) {
      outMax = 3.0;
    }
    *inMin = (1.0 / outMax) * (1.0 / outMax);
    *inMax = *inMax * *inMax;
  }
  return bVar1;
}

Assistant:

static inline bool transformValueRange (float outMin, float outMax, float& inMin, float& inMax)
	{
		// Limited due to accuracy reasons
		const float rangeMin = 0.4f;
		const float rangeMax = 3.0f;

		if (outMax < rangeMin || outMin > rangeMax)
			return false; // Out of range

		inMax = 1.0f/deFloatMax(outMin, rangeMin);
		inMin = 1.0f/deFloatMin(outMax, rangeMax);

		inMin *= inMin;
		inMax *= inMax;

		return true;
	}